

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutations.h
# Opt level: O2

void wasm::setIdentity(vector<unsigned_int,_std::allocator<unsigned_int>_> *ret)

{
  pointer puVar1;
  long lVar2;
  Index i;
  uint uVar3;
  
  puVar1 = (ret->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(ret->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar2 != 0) {
    for (uVar3 = 0; (ulong)uVar3 < (ulong)(lVar2 >> 2); uVar3 = uVar3 + 1) {
      puVar1[uVar3] = uVar3;
    }
    return;
  }
  __assert_fail("num > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/permutations.h"
                ,0x25,"void wasm::setIdentity(std::vector<Index> &)");
}

Assistant:

inline void setIdentity(std::vector<Index>& ret) {
  auto num = ret.size();
  assert(num > 0); // must already be of the right size
  for (Index i = 0; i < num; i++) {
    ret[i] = i;
  }
}